

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O1

void re2::EmptyCharsetFuzz(void)

{
  bool bVar1;
  long lVar2;
  StringPiece local_1c0;
  LogMessage local_1b0;
  
  lVar2 = 0;
  do {
    RE2::RE2((RE2 *)&local_1b0,
             (char *)((long)&_ZZN3re216EmptyCharsetFuzzEvE7empties_rel +
                     (long)*(int *)((long)&_ZZN3re216EmptyCharsetFuzzEvE7empties_rel + lVar2)));
    local_1c0.ptr_ = "abc";
    local_1c0.length_ = 3;
    bVar1 = RE2::Match((RE2 *)&local_1b0,&local_1c0,0,3,UNANCHORED,(StringPiece *)0x0,0);
    RE2::~RE2((RE2 *)&local_1b0);
    if (bVar1) {
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0x1fd,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0.str_,
                 "Check failed: !RE2(empties[i]).Match(\"abc\", 0, 3, RE2::UNANCHORED, NULL, 0)",
                 0x4b);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    }
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x10);
  return;
}

Assistant:

TEST(EmptyCharset, Fuzz) {
  static const char *empties[] = {
    "[^\\S\\s]",
    "[^\\S[:space:]]",
    "[^\\D\\d]",
    "[^\\D[:digit:]]"
  };
  for (int i = 0; i < arraysize(empties); i++)
    CHECK(!RE2(empties[i]).Match("abc", 0, 3, RE2::UNANCHORED, NULL, 0));
}